

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_read_file_header_2(archive_read *a,lha *lha)

{
  uint16_t uVar1;
  uint32_t uVar2;
  wchar_t wVar3;
  uint16_t local_3a;
  int local_38;
  wchar_t wStack_34;
  uint16_t header_crc;
  wchar_t padding;
  wchar_t err;
  size_t extdsize;
  uchar *p;
  lha *lha_local;
  archive_read *a_local;
  
  p = (uchar *)lha;
  lha_local = (lha *)a;
  extdsize = (size_t)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
  if ((void *)extdsize == (void *)0x0) {
    a_local._4_4_ = truncated_error((archive_read *)lha_local);
  }
  else {
    uVar1 = archive_le16dec((void *)extdsize);
    *(ulong *)(p + 0x20) = (ulong)uVar1;
    uVar2 = archive_le32dec((void *)(extdsize + 7));
    *(ulong *)(p + 0x30) = (ulong)uVar2;
    uVar2 = archive_le32dec((void *)(extdsize + 0xb));
    *(ulong *)(p + 0x38) = (ulong)uVar2;
    uVar2 = archive_le32dec((void *)(extdsize + 0xf));
    *(ulong *)(p + 0x58) = (ulong)uVar2;
    uVar1 = archive_le16dec((void *)(extdsize + 0x15));
    *(uint16_t *)(p + 0xba) = uVar1;
    *(uint *)(p + 0x40) = *(uint *)(p + 0x40) | 8;
    if (*(ulong *)(p + 0x20) < 0x18) {
      archive_set_error((archive *)lha_local,0x54,"Invalid LHa header size");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      local_3a = lha_crc16(0,(void *)extdsize,0x18);
      __archive_read_consume((archive_read *)lha_local,0x18);
      wStack_34 = lha_read_file_extended_header
                            ((archive_read *)lha_local,(lha *)p,&local_3a,L'\x02',
                             *(long *)(p + 0x20) - 0x18,(size_t *)&padding);
      a_local._4_4_ = wStack_34;
      if (L'\xffffffeb' < wStack_34) {
        local_38 = (int)*(undefined8 *)(p + 0x20) - (padding + L'\x18');
        if (0 < local_38) {
          extdsize = (size_t)__archive_read_ahead
                                       ((archive_read *)lha_local,(long)local_38,(ssize_t *)0x0);
          if ((void *)extdsize == (void *)0x0) {
            wVar3 = truncated_error((archive_read *)lha_local);
            return wVar3;
          }
          local_3a = lha_crc16(local_3a,(void *)extdsize,(long)local_38);
          __archive_read_consume((archive_read *)lha_local,(long)local_38);
        }
        if (local_3a == *(uint16_t *)(p + 0xb8)) {
          a_local._4_4_ = wStack_34;
        }
        else {
          archive_set_error((archive *)lha_local,0x54,"LHa header CRC error");
          a_local._4_4_ = L'\xffffffe2';
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
lha_read_file_header_2(struct archive_read *a, struct lha *lha)
{
	const unsigned char *p;
	size_t extdsize;
	int err, padding;
	uint16_t header_crc;

	if ((p = __archive_read_ahead(a, H2_FIXED_SIZE, NULL)) == NULL)
		return (truncated_error(a));

	lha->header_size =archive_le16dec(p + H2_HEADER_SIZE_OFFSET);
	lha->compsize = archive_le32dec(p + H2_COMP_SIZE_OFFSET);
	lha->origsize = archive_le32dec(p + H2_ORIG_SIZE_OFFSET);
	lha->mtime = archive_le32dec(p + H2_TIME_OFFSET);
	lha->crc = archive_le16dec(p + H2_CRC_OFFSET);
	lha->setflag |= CRC_IS_SET;

	if (lha->header_size < H2_FIXED_SIZE) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Invalid LHa header size");
		return (ARCHIVE_FATAL);
	}

	header_crc = lha_crc16(0, p, H2_FIXED_SIZE);
	__archive_read_consume(a, H2_FIXED_SIZE);

	/* Read extended headers */
	err = lha_read_file_extended_header(a, lha, &header_crc, 2,
		  lha->header_size - H2_FIXED_SIZE, &extdsize);
	if (err < ARCHIVE_WARN)
		return (err);

	/* Calculate a padding size. The result will be normally 0 or 1. */
	padding = (int)lha->header_size - (int)(H2_FIXED_SIZE + extdsize);
	if (padding > 0) {
		if ((p = __archive_read_ahead(a, padding, NULL)) == NULL)
			return (truncated_error(a));
		header_crc = lha_crc16(header_crc, p, padding);
		__archive_read_consume(a, padding);
	}

	if (header_crc != lha->header_crc) {
#ifndef DONT_FAIL_ON_CRC_ERROR
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "LHa header CRC error");
		return (ARCHIVE_FATAL);
#endif
	}
	return (err);
}